

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O1

int __thiscall dgrminer::PartialUnion::getLabelEncoding(PartialUnion *this,string *label)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  iterator iVar3;
  _Base_ptr p_Var4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_48;
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->labelEncoding)._M_t,label);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->labelEncoding)._M_t._M_impl.super__Rb_tree_header)
  {
    this->number_of_labels = this->number_of_labels + 1;
    paVar1 = &local_48.first.field_2;
    pcVar2 = (label->_M_dataplus)._M_p;
    local_48.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar2,pcVar2 + label->_M_string_length);
    local_48.second = this->number_of_labels;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                *)&this->labelEncoding,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_48.first._M_dataplus._M_p);
    }
    p_Var4 = (_Base_ptr)&this->number_of_labels;
  }
  else {
    p_Var4 = iVar3._M_node + 2;
  }
  return p_Var4->_M_color;
}

Assistant:

int PartialUnion::getLabelEncoding(string label)
	{
		auto it = labelEncoding.find(label);
		if (it != labelEncoding.end()) {
			return it->second;
		}
		else {
			(number_of_labels)++;
			labelEncoding.insert(std::make_pair(label, number_of_labels));
			return number_of_labels;
		}
	}